

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16781328,_false,_embree::sse42::VirtualCurveIntersectorK<4>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  byte bVar1;
  BVH *bvh;
  void *pvVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  vbool<4> vVar10;
  char cVar11;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  undefined4 uVar15;
  AABBNodeMB4D *node1;
  uint uVar16;
  ulong uVar17;
  RayQueryContext *pRVar18;
  RayQueryContext *pRVar19;
  RayQueryContext *extraout_RDX;
  NodeRef root;
  size_t sVar20;
  Intersectors *pIVar21;
  ulong uVar22;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar23;
  NodeRef *pNVar24;
  int iVar25;
  float fVar26;
  float fVar27;
  float fVar44;
  float fVar45;
  vint4 ai;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar46;
  float fVar47;
  float fVar50;
  int iVar52;
  float fVar53;
  int iVar56;
  vint4 ai_1;
  undefined1 auVar48 [16];
  float fVar51;
  float fVar54;
  float fVar55;
  float fVar57;
  float fVar58;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar49;
  int iVar59;
  float fVar62;
  float fVar63;
  vint4 ai_3;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar67 [16];
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar83;
  float fVar85;
  float fVar86;
  float fVar88;
  vint4 ai_2;
  float fVar89;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  uint uVar84;
  uint uVar87;
  uint uVar90;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar91;
  float fVar92;
  float fVar93;
  vint4 bi;
  float fVar94;
  float fVar95;
  float fVar98;
  float fVar99;
  vint4 bi_3;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  vint4 bi_1;
  float fVar104;
  uint uVar105;
  uint uVar106;
  uint uVar107;
  float fVar108;
  vint4 bi_2;
  uint uVar109;
  float fVar110;
  vfloat4 a0;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar113;
  float fVar116;
  float fVar117;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar121;
  vint4 bi_12;
  vint4 bi_9;
  TravRayK<4,_false> *tray_00;
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_false> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar9 = mm_lookupmask_ps._8_8_;
  uVar8 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  sVar20 = (bvh->root).ptr;
  if (sVar20 != 8) {
    auVar60 = *(undefined1 (*) [16])(ray + 0x80);
    auVar48._0_4_ = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar60._0_4_);
    auVar48._4_4_ = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar60._4_4_);
    auVar48._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar60._8_4_);
    auVar48._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar60._12_4_);
    uVar16 = movmskps((int)context,auVar48);
    if (uVar16 != 0) {
      uVar17 = (ulong)(uVar16 & 0xff);
      pRVar19 = (RayQueryContext *)pre.ray_space;
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      fVar77 = tray.dir.field_0._0_4_;
      fVar83 = tray.dir.field_0._4_4_;
      fVar86 = tray.dir.field_0._8_4_;
      fVar89 = tray.dir.field_0._12_4_;
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      fVar46 = tray.dir.field_0._16_4_;
      fVar50 = tray.dir.field_0._20_4_;
      fVar53 = tray.dir.field_0._24_4_;
      fVar57 = tray.dir.field_0._28_4_;
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar64 = tray.dir.field_0._32_4_;
      fVar68 = tray.dir.field_0._36_4_;
      fVar71 = tray.dir.field_0._40_4_;
      fVar74 = tray.dir.field_0._44_4_;
      auVar96._0_4_ = fVar46 * fVar46 + fVar64 * fVar64;
      auVar96._4_4_ = fVar50 * fVar50 + fVar68 * fVar68;
      auVar96._8_4_ = fVar53 * fVar53 + fVar71 * fVar71;
      auVar96._12_4_ = fVar57 * fVar57 + fVar74 * fVar74;
      auVar111._0_4_ = fVar77 * fVar77 + auVar96._0_4_;
      auVar111._4_4_ = fVar83 * fVar83 + auVar96._4_4_;
      auVar111._8_4_ = fVar86 * fVar86 + auVar96._8_4_;
      auVar111._12_4_ = fVar89 * fVar89 + auVar96._12_4_;
      auVar96 = rsqrtps(auVar96,auVar111);
      fVar94 = auVar96._0_4_;
      fVar26 = auVar96._4_4_;
      fVar27 = auVar96._8_4_;
      fVar44 = auVar96._12_4_;
      pre.depth_scale.field_0.v[0] = fVar94 * fVar94 * auVar111._0_4_ * -0.5 * fVar94 + fVar94 * 1.5
      ;
      pre.depth_scale.field_0.v[1] = fVar26 * fVar26 * auVar111._4_4_ * -0.5 * fVar26 + fVar26 * 1.5
      ;
      pre.depth_scale.field_0.v[2] = fVar27 * fVar27 * auVar111._8_4_ * -0.5 * fVar27 + fVar27 * 1.5
      ;
      pre.depth_scale.field_0.v[3] =
           fVar44 * fVar44 * auVar111._12_4_ * -0.5 * fVar44 + fVar44 * 1.5;
      do {
        lVar3 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        auVar111 = insertps(ZEXT416(*(uint *)(ray + lVar3 * 4 + 0x40)),
                            *(undefined4 *)(ray + lVar3 * 4 + 0x50),0x1c);
        auVar111 = insertps(auVar111,*(undefined4 *)(ray + lVar3 * 4 + 0x60),0x28);
        fVar94 = *(float *)((long)pre.ray_space + lVar3 * 4 + -0x10);
        auVar112._0_4_ = auVar111._0_4_ * fVar94;
        auVar112._4_4_ = auVar111._4_4_ * fVar94;
        auVar112._8_4_ = auVar111._8_4_ * fVar94;
        auVar112._12_4_ = auVar111._12_4_ * fVar94;
        uVar22 = CONCAT44(auVar112._4_4_,auVar112._4_4_);
        auVar28._0_8_ = uVar22 ^ 0x8000000080000000;
        auVar28._8_4_ = -auVar112._12_4_;
        auVar28._12_4_ = -auVar112._12_4_;
        auVar111 = blendps(auVar28,ZEXT816(0),0xe);
        auVar120._4_4_ = auVar111._0_4_;
        auVar120._0_4_ = auVar112._8_4_;
        auVar120._8_4_ = auVar111._4_4_;
        auVar120._12_4_ = 0;
        auVar119._4_4_ = auVar111._0_4_;
        auVar119._0_4_ = auVar112._8_4_;
        auVar119._8_4_ = auVar111._4_4_;
        auVar119._12_4_ = 0;
        auVar119 = dpps(auVar119 << 0x20,auVar120 << 0x20,0x7f);
        uVar22 = CONCAT44(auVar112._12_4_,auVar112._8_4_);
        auVar114._0_8_ = uVar22 ^ 0x8000000080000000;
        auVar114._8_4_ = -auVar112._8_4_;
        auVar114._12_4_ = -auVar112._12_4_;
        auVar96 = insertps(auVar114,auVar112,0x2a);
        auVar111 = dpps(auVar96,auVar96,0x7f);
        iVar25 = -(uint)(auVar111._0_4_ < auVar119._0_4_);
        auVar29._4_4_ = iVar25;
        auVar29._0_4_ = iVar25;
        auVar29._8_4_ = iVar25;
        auVar29._12_4_ = iVar25;
        auVar111 = blendvps(auVar96,auVar120 << 0x20,auVar29);
        auVar96 = dpps(auVar111,auVar111,0x7f);
        auVar120 = rsqrtss(auVar96,auVar96);
        fVar26 = auVar120._0_4_;
        fVar26 = fVar26 * 1.5 - fVar26 * fVar26 * auVar96._0_4_ * 0.5 * fVar26;
        fVar27 = fVar26 * auVar111._0_4_;
        fVar44 = fVar26 * auVar111._4_4_;
        fVar45 = fVar26 * auVar111._8_4_;
        fVar26 = fVar26 * auVar111._12_4_;
        fVar113 = fVar44 * auVar112._0_4_ - auVar112._4_4_ * fVar27;
        fVar116 = fVar45 * auVar112._4_4_ - auVar112._8_4_ * fVar44;
        fVar117 = fVar27 * auVar112._8_4_ - auVar112._0_4_ * fVar45;
        auVar115._12_4_ = fVar26 * auVar112._12_4_ - auVar112._12_4_ * fVar26;
        auVar115._0_8_ = CONCAT44(fVar117,fVar116);
        auVar115._8_4_ = fVar113;
        auVar118._8_4_ = fVar113;
        auVar118._0_8_ = auVar115._0_8_;
        auVar118._12_4_ = auVar115._12_4_;
        auVar111 = dpps(auVar118,auVar115,0x7f);
        pIVar21 = (Intersectors *)(uVar17 - 1);
        auVar96 = rsqrtss(auVar111,auVar111);
        fVar26 = auVar96._0_4_;
        fVar26 = fVar26 * 1.5 - fVar26 * fVar26 * auVar111._0_4_ * 0.5 * fVar26;
        aVar30.m128[1] = fVar26 * fVar113;
        aVar30.m128[0] = fVar45;
        aVar30.m128[2] = auVar112._8_4_ * fVar94;
        aVar30.m128[3] = 0.0;
        (((LinearSpace3fa *)((long)pRVar19 + lVar3 * 0x30))->vx).field_0.m128[0] = fVar27;
        pre.ray_space[lVar3].vx.field_0.m128[1] = fVar26 * fVar116;
        pre.ray_space[lVar3].vx.field_0.m128[2] = auVar112._0_4_ * fVar94;
        pre.ray_space[lVar3].vx.field_0.m128[3] = 0.0;
        aVar7.m128[1] = fVar26 * fVar117;
        aVar7.m128[0] = fVar44;
        aVar7.m128[2] = auVar112._4_4_ * fVar94;
        aVar7.m128[3] = 0.0;
        pre.ray_space[lVar3].vy.field_0 = aVar7;
        pre.ray_space[lVar3].vz.field_0 = aVar30;
        uVar17 = uVar17 & (ulong)pIVar21;
      } while (uVar17 != 0);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      fVar94 = (float)DAT_01f80d30;
      fVar26 = DAT_01f80d30._4_4_;
      fVar27 = DAT_01f80d30._8_4_;
      fVar44 = DAT_01f80d30._12_4_;
      auVar31._4_4_ = -(uint)(ABS(fVar83) < fVar26);
      auVar31._0_4_ = -(uint)(ABS(fVar77) < fVar94);
      auVar31._8_4_ = -(uint)(ABS(fVar86) < fVar27);
      auVar31._12_4_ = -(uint)(ABS(fVar89) < fVar44);
      auVar119 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01f80d30,auVar31
                         );
      auVar32._4_4_ = -(uint)(ABS(fVar50) < fVar26);
      auVar32._0_4_ = -(uint)(ABS(fVar46) < fVar94);
      auVar32._8_4_ = -(uint)(ABS(fVar53) < fVar27);
      auVar32._12_4_ = -(uint)(ABS(fVar57) < fVar44);
      auVar96 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01f80d30,auVar32)
      ;
      auVar33._4_4_ = -(uint)(ABS(fVar68) < fVar26);
      auVar33._0_4_ = -(uint)(ABS(fVar64) < fVar94);
      auVar33._8_4_ = -(uint)(ABS(fVar71) < fVar27);
      auVar33._12_4_ = -(uint)(ABS(fVar74) < fVar44);
      auVar120 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01f80d30,auVar33
                         );
      auVar111 = rcpps(auVar33,auVar119);
      fVar46 = auVar111._0_4_;
      auVar79._0_4_ = auVar119._0_4_ * fVar46;
      fVar50 = auVar111._4_4_;
      auVar79._4_4_ = auVar119._4_4_ * fVar50;
      fVar53 = auVar111._8_4_;
      auVar79._8_4_ = auVar119._8_4_ * fVar53;
      fVar57 = auVar111._12_4_;
      auVar79._12_4_ = auVar119._12_4_ * fVar57;
      tray.rdir.field_0._0_4_ = (1.0 - auVar79._0_4_) * fVar46 + fVar46;
      tray.rdir.field_0._4_4_ = (1.0 - auVar79._4_4_) * fVar50 + fVar50;
      tray.rdir.field_0._8_4_ = (1.0 - auVar79._8_4_) * fVar53 + fVar53;
      tray.rdir.field_0._12_4_ = (1.0 - auVar79._12_4_) * fVar57 + fVar57;
      auVar111 = rcpps(auVar79,auVar96);
      fVar46 = auVar111._0_4_;
      fVar50 = auVar111._4_4_;
      fVar53 = auVar111._8_4_;
      fVar57 = auVar111._12_4_;
      tray.rdir.field_0._16_4_ = (1.0 - auVar96._0_4_ * fVar46) * fVar46 + fVar46;
      tray.rdir.field_0._20_4_ = (1.0 - auVar96._4_4_ * fVar50) * fVar50 + fVar50;
      tray.rdir.field_0._24_4_ = (1.0 - auVar96._8_4_ * fVar53) * fVar53 + fVar53;
      tray.rdir.field_0._28_4_ = (1.0 - auVar96._12_4_ * fVar57) * fVar57 + fVar57;
      auVar111 = rcpps(auVar111,auVar120);
      fVar46 = auVar111._0_4_;
      fVar50 = auVar111._4_4_;
      fVar53 = auVar111._8_4_;
      fVar57 = auVar111._12_4_;
      tray.rdir.field_0._32_4_ = (1.0 - auVar120._0_4_ * fVar46) * fVar46 + fVar46;
      tray.rdir.field_0._36_4_ = (1.0 - auVar120._4_4_ * fVar50) * fVar50 + fVar50;
      tray.rdir.field_0._40_4_ = (1.0 - auVar120._8_4_ * fVar53) * fVar53 + fVar53;
      tray.rdir.field_0._44_4_ = (1.0 - auVar120._12_4_ * fVar57) * fVar57 + fVar57;
      auVar80._0_12_ = ZEXT812(0);
      auVar80._12_4_ = 0;
      tray.nearXYZ.field_0._0_4_ = -(uint)((float)tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)((float)tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar34._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar34._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar34._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar34._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeed0,_DAT_01f8c1f0,auVar34);
      auVar35._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar35._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar35._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar35._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeef0,_DAT_01faeee0,auVar35);
      auVar111 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar80);
      auVar60 = maxps(auVar60,auVar80);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f7a9f0,auVar111,auVar48);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f7aa00,auVar60,auVar48);
      auVar60._8_4_ = 0xffffffff;
      auVar60._0_8_ = 0xffffffffffffffff;
      auVar60._12_4_ = 0xffffffff;
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar60 ^ auVar48);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar16 = 3;
      }
      else {
        uVar16 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar24 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar23 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01f7a9f0;
      stack_node[1].ptr = sVar20;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      uVar13 = 0x21d2f80;
      aVar121 = _DAT_01f7a9f0;
LAB_0023dea4:
      do {
        do {
          root.ptr = pNVar24[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0023e66a;
          pNVar24 = pNVar24 + -1;
          paVar23 = paVar23 + -1;
          aVar49.i = *(int (*) [4])paVar23->v;
          auVar36._4_4_ = -(uint)(aVar49.v[1] < tray.tfar.field_0.v[1]);
          auVar36._0_4_ = -(uint)(aVar49.v[0] < tray.tfar.field_0.v[0]);
          auVar36._8_4_ = -(uint)(aVar49.v[2] < tray.tfar.field_0.v[2]);
          auVar36._12_4_ = -(uint)(aVar49._12_4_ < tray.tfar.field_0.v[3]);
          uVar13 = movmskps(uVar13,auVar36);
        } while (uVar13 == 0);
        uVar17 = (ulong)(byte)uVar13;
        uVar14 = POPCOUNT(uVar13 & 0xff);
        uVar13 = uVar14;
        if (uVar16 < uVar14) {
LAB_0023dee4:
          do {
            vVar10.field_0 = terminated.field_0;
            pRVar18 = (RayQueryContext *)&DAT_fffffffffffffff0;
            fVar46 = aVar49.v[0];
            fVar50 = aVar49.v[1];
            fVar53 = aVar49.v[2];
            fVar57 = aVar49.v[3];
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0023e66a;
              auVar42._4_4_ = -(uint)(fVar50 < tray.tfar.field_0.v[1]);
              auVar42._0_4_ = -(uint)(fVar46 < tray.tfar.field_0.v[0]);
              auVar42._8_4_ = -(uint)(fVar53 < tray.tfar.field_0.v[2]);
              auVar42._12_4_ = -(uint)(fVar57 < tray.tfar.field_0.v[3]);
              uVar13 = movmskps(uVar13,auVar42);
              if (uVar13 != 0) {
                bVar1 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                uVar17 = (ulong)bVar1;
                pvVar2 = This->leafIntersector;
                valid_o.field_0._8_8_ = uVar9;
                valid_o.field_0._0_8_ = uVar8;
                uVar13 = movmskps((int)pRVar19,(undefined1  [16])terminated.field_0);
                uVar13 = uVar13 ^ 0xf;
                pRVar19 = (RayQueryContext *)(ulong)uVar13;
                if (uVar13 != 0) {
                  uVar22 = (ulong)(byte)uVar13;
                  do {
                    lVar3 = 0;
                    if (uVar22 != 0) {
                      for (; (uVar22 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                      }
                    }
                    pIVar21 = (Intersectors *)&pre;
                    cVar11 = (**(code **)((long)pvVar2 + (ulong)bVar1 * 0x40 + 0x18))
                                       (pIVar21,ray,lVar3,context,
                                        (byte *)(root.ptr & 0xfffffffffffffff0));
                    if (cVar11 != '\0') {
                      valid_o.field_0.i[lVar3] = -1;
                    }
                    uVar17 = uVar22 - 1;
                    uVar22 = uVar22 & uVar17;
                    pRVar19 = extraout_RDX;
                    aVar121 = _DAT_01f7a9f0;
                  } while (uVar22 != 0);
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     ((undefined1  [16])valid_o.field_0 | (undefined1  [16])vVar10.field_0);
                uVar13 = movmskps((int)uVar17,(undefined1  [16])terminated.field_0);
                if (uVar13 == 0xf) goto LAB_0023e66a;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                              (undefined1  [16])terminated.field_0);
              }
              goto LAB_0023dea4;
            }
            uVar17 = root.ptr & 0xfffffffffffffff0;
            uVar13 = (uint)root.ptr & 7;
            iVar25 = aVar121.i[0];
            iVar52 = aVar121.i[1];
            iVar56 = aVar121.i[2];
            iVar59 = aVar121.i[3];
            sVar20 = 8;
            do {
              root.ptr = *(size_t *)(uVar17 + 0x20 + (long)pRVar18 * 2);
              if (root.ptr == 8) {
                aVar49.i[1] = iVar52;
                aVar49.i[0] = iVar25;
                aVar49.i[2] = iVar56;
                aVar49.i[3] = iVar59;
                root.ptr = sVar20;
                break;
              }
              if ((uVar13 == 6) || (uVar13 == 1)) {
                fVar64 = *(float *)((long)&pRVar18[6].scene + uVar17);
                fVar68 = *(float *)((long)&pRVar18[2].scene + uVar17);
                fVar71 = *(float *)((long)&pRVar18[2].args + uVar17);
                fVar74 = *(float *)((long)&pRVar18[3].user + uVar17);
                fVar77 = *(float *)((long)&pRVar18[4].scene + uVar17);
                auVar60 = *(undefined1 (*) [16])(ray + 0x70);
                fVar65 = auVar60._0_4_;
                fVar69 = auVar60._4_4_;
                fVar72 = auVar60._8_4_;
                fVar75 = auVar60._12_4_;
                fVar83 = *(float *)((long)&pRVar18[7].user + uVar17);
                fVar86 = *(float *)((long)&pRVar18[8].args + uVar17);
                fVar89 = *(float *)((long)&pRVar18[4].args + uVar17);
                fVar94 = *(float *)((long)&pRVar18[6].args + uVar17);
                fVar26 = *(float *)((long)&pRVar18[8].scene + uVar17);
                fVar27 = *(float *)((long)&pRVar18[9].user + uVar17);
                fVar44 = *(float *)((long)&pRVar18[5].user + uVar17);
                fVar45 = ((fVar64 * fVar65 + fVar68) - (float)tray.org.field_0._0_4_) *
                         (float)tray.rdir.field_0._0_4_;
                fVar113 = ((fVar64 * fVar69 + fVar68) - (float)tray.org.field_0._4_4_) *
                          (float)tray.rdir.field_0._4_4_;
                fVar116 = ((fVar64 * fVar72 + fVar68) - (float)tray.org.field_0._8_4_) *
                          (float)tray.rdir.field_0._8_4_;
                fVar64 = ((fVar64 * fVar75 + fVar68) - (float)tray.org.field_0._12_4_) *
                         (float)tray.rdir.field_0._12_4_;
                fVar68 = ((fVar83 * fVar65 + fVar74) - (float)tray.org.field_0._16_4_) *
                         (float)tray.rdir.field_0._16_4_;
                fVar117 = ((fVar83 * fVar69 + fVar74) - (float)tray.org.field_0._20_4_) *
                          (float)tray.rdir.field_0._20_4_;
                fVar54 = ((fVar83 * fVar72 + fVar74) - (float)tray.org.field_0._24_4_) *
                         (float)tray.rdir.field_0._24_4_;
                fVar74 = ((fVar83 * fVar75 + fVar74) - (float)tray.org.field_0._28_4_) *
                         (float)tray.rdir.field_0._28_4_;
                fVar83 = ((fVar86 * fVar65 + fVar89) - (float)tray.org.field_0._32_4_) *
                         (float)tray.rdir.field_0._32_4_;
                fVar62 = ((fVar86 * fVar69 + fVar89) - (float)tray.org.field_0._36_4_) *
                         (float)tray.rdir.field_0._36_4_;
                fVar63 = ((fVar86 * fVar72 + fVar89) - (float)tray.org.field_0._40_4_) *
                         (float)tray.rdir.field_0._40_4_;
                fVar86 = ((fVar86 * fVar75 + fVar89) - (float)tray.org.field_0._44_4_) *
                         (float)tray.rdir.field_0._44_4_;
                fVar89 = ((fVar94 * fVar65 + fVar71) - (float)tray.org.field_0._0_4_) *
                         (float)tray.rdir.field_0._0_4_;
                fVar92 = ((fVar94 * fVar69 + fVar71) - (float)tray.org.field_0._4_4_) *
                         (float)tray.rdir.field_0._4_4_;
                fVar93 = ((fVar94 * fVar72 + fVar71) - (float)tray.org.field_0._8_4_) *
                         (float)tray.rdir.field_0._8_4_;
                fVar71 = ((fVar94 * fVar75 + fVar71) - (float)tray.org.field_0._12_4_) *
                         (float)tray.rdir.field_0._12_4_;
                fVar101 = ((fVar26 * fVar65 + fVar77) - (float)tray.org.field_0._16_4_) *
                          (float)tray.rdir.field_0._16_4_;
                fVar102 = ((fVar26 * fVar69 + fVar77) - (float)tray.org.field_0._20_4_) *
                          (float)tray.rdir.field_0._20_4_;
                fVar103 = ((fVar26 * fVar72 + fVar77) - (float)tray.org.field_0._24_4_) *
                          (float)tray.rdir.field_0._24_4_;
                fVar104 = ((fVar26 * fVar75 + fVar77) - (float)tray.org.field_0._28_4_) *
                          (float)tray.rdir.field_0._28_4_;
                fVar77 = ((fVar27 * fVar65 + fVar44) - (float)tray.org.field_0._32_4_) *
                         (float)tray.rdir.field_0._32_4_;
                fVar94 = ((fVar27 * fVar69 + fVar44) - (float)tray.org.field_0._36_4_) *
                         (float)tray.rdir.field_0._36_4_;
                fVar26 = ((fVar27 * fVar72 + fVar44) - (float)tray.org.field_0._40_4_) *
                         (float)tray.rdir.field_0._40_4_;
                fVar27 = ((fVar27 * fVar75 + fVar44) - (float)tray.org.field_0._44_4_) *
                         (float)tray.rdir.field_0._44_4_;
                uVar14 = (uint)((int)fVar89 < (int)fVar45) * (int)fVar89 |
                         (uint)((int)fVar89 >= (int)fVar45) * (int)fVar45;
                uVar84 = (uint)((int)fVar92 < (int)fVar113) * (int)fVar92 |
                         (uint)((int)fVar92 >= (int)fVar113) * (int)fVar113;
                uVar87 = (uint)((int)fVar93 < (int)fVar116) * (int)fVar93 |
                         (uint)((int)fVar93 >= (int)fVar116) * (int)fVar116;
                uVar90 = (uint)((int)fVar71 < (int)fVar64) * (int)fVar71 |
                         (uint)((int)fVar71 >= (int)fVar64) * (int)fVar64;
                uVar105 = (uint)((int)fVar101 < (int)fVar68) * (int)fVar101 |
                          (uint)((int)fVar101 >= (int)fVar68) * (int)fVar68;
                uVar106 = (uint)((int)fVar102 < (int)fVar117) * (int)fVar102 |
                          (uint)((int)fVar102 >= (int)fVar117) * (int)fVar117;
                uVar107 = (uint)((int)fVar103 < (int)fVar54) * (int)fVar103 |
                          (uint)((int)fVar103 >= (int)fVar54) * (int)fVar54;
                uVar109 = (uint)((int)fVar104 < (int)fVar74) * (int)fVar104 |
                          (uint)((int)fVar104 >= (int)fVar74) * (int)fVar74;
                uVar105 = ((int)uVar105 < (int)uVar14) * uVar14 |
                          ((int)uVar105 >= (int)uVar14) * uVar105;
                uVar106 = ((int)uVar106 < (int)uVar84) * uVar84 |
                          ((int)uVar106 >= (int)uVar84) * uVar106;
                uVar107 = ((int)uVar107 < (int)uVar87) * uVar87 |
                          ((int)uVar107 >= (int)uVar87) * uVar107;
                uVar109 = ((int)uVar109 < (int)uVar90) * uVar90 |
                          ((int)uVar109 >= (int)uVar90) * uVar109;
                uVar14 = (uint)((int)fVar77 < (int)fVar83) * (int)fVar77 |
                         (uint)((int)fVar77 >= (int)fVar83) * (int)fVar83;
                uVar84 = (uint)((int)fVar94 < (int)fVar62) * (int)fVar94 |
                         (uint)((int)fVar94 >= (int)fVar62) * (int)fVar62;
                uVar87 = (uint)((int)fVar26 < (int)fVar63) * (int)fVar26 |
                         (uint)((int)fVar26 >= (int)fVar63) * (int)fVar63;
                uVar90 = (uint)((int)fVar27 < (int)fVar86) * (int)fVar27 |
                         (uint)((int)fVar27 >= (int)fVar86) * (int)fVar86;
                auVar81._0_4_ =
                     ((int)uVar14 < (int)uVar105) * uVar105 | ((int)uVar14 >= (int)uVar105) * uVar14
                ;
                auVar81._4_4_ =
                     ((int)uVar84 < (int)uVar106) * uVar106 | ((int)uVar84 >= (int)uVar106) * uVar84
                ;
                auVar81._8_4_ =
                     ((int)uVar87 < (int)uVar107) * uVar107 | ((int)uVar87 >= (int)uVar107) * uVar87
                ;
                auVar81._12_4_ =
                     ((int)uVar90 < (int)uVar109) * uVar109 | ((int)uVar90 >= (int)uVar109) * uVar90
                ;
                uVar14 = (uint)((int)fVar89 < (int)fVar45) * (int)fVar45 |
                         (uint)((int)fVar89 >= (int)fVar45) * (int)fVar89;
                uVar84 = (uint)((int)fVar92 < (int)fVar113) * (int)fVar113 |
                         (uint)((int)fVar92 >= (int)fVar113) * (int)fVar92;
                uVar87 = (uint)((int)fVar93 < (int)fVar116) * (int)fVar116 |
                         (uint)((int)fVar93 >= (int)fVar116) * (int)fVar93;
                uVar90 = (uint)((int)fVar71 < (int)fVar64) * (int)fVar64 |
                         (uint)((int)fVar71 >= (int)fVar64) * (int)fVar71;
                uVar105 = (uint)((int)fVar101 < (int)fVar68) * (int)fVar68 |
                          (uint)((int)fVar101 >= (int)fVar68) * (int)fVar101;
                uVar106 = (uint)((int)fVar102 < (int)fVar117) * (int)fVar117 |
                          (uint)((int)fVar102 >= (int)fVar117) * (int)fVar102;
                uVar107 = (uint)((int)fVar103 < (int)fVar54) * (int)fVar54 |
                          (uint)((int)fVar103 >= (int)fVar54) * (int)fVar103;
                uVar109 = (uint)((int)fVar104 < (int)fVar74) * (int)fVar74 |
                          (uint)((int)fVar104 >= (int)fVar74) * (int)fVar104;
                uVar105 = ((int)uVar14 < (int)uVar105) * uVar14 |
                          ((int)uVar14 >= (int)uVar105) * uVar105;
                uVar106 = ((int)uVar84 < (int)uVar106) * uVar84 |
                          ((int)uVar84 >= (int)uVar106) * uVar106;
                uVar107 = ((int)uVar87 < (int)uVar107) * uVar87 |
                          ((int)uVar87 >= (int)uVar107) * uVar107;
                uVar109 = ((int)uVar90 < (int)uVar109) * uVar90 |
                          ((int)uVar90 >= (int)uVar109) * uVar109;
                uVar14 = (uint)((int)fVar77 < (int)fVar83) * (int)fVar83 |
                         (uint)((int)fVar77 >= (int)fVar83) * (int)fVar77;
                uVar84 = (uint)((int)fVar94 < (int)fVar62) * (int)fVar62 |
                         (uint)((int)fVar94 >= (int)fVar62) * (int)fVar94;
                uVar87 = (uint)((int)fVar26 < (int)fVar63) * (int)fVar63 |
                         (uint)((int)fVar26 >= (int)fVar63) * (int)fVar26;
                uVar90 = (uint)((int)fVar27 < (int)fVar86) * (int)fVar86 |
                         (uint)((int)fVar27 >= (int)fVar86) * (int)fVar27;
                uVar14 = ((int)uVar105 < (int)uVar14) * uVar105 |
                         ((int)uVar105 >= (int)uVar14) * uVar14;
                uVar84 = ((int)uVar106 < (int)uVar84) * uVar106 |
                         ((int)uVar106 >= (int)uVar84) * uVar84;
                uVar87 = ((int)uVar107 < (int)uVar87) * uVar107 |
                         ((int)uVar107 >= (int)uVar87) * uVar87;
                uVar90 = ((int)uVar109 < (int)uVar90) * uVar109 |
                         ((int)uVar109 >= (int)uVar90) * uVar90;
                bVar12 = (float)((tray.tnear.field_0.i[0] < (int)auVar81._0_4_) * auVar81._0_4_ |
                                (uint)(tray.tnear.field_0.i[0] >= (int)auVar81._0_4_) *
                                tray.tnear.field_0.i[0]) <=
                         (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar14) *
                                 tray.tfar.field_0.i[0] |
                                (tray.tfar.field_0.i[0] >= (int)uVar14) * uVar14);
                uVar14 = -(uint)bVar12;
                bVar4 = (float)((tray.tnear.field_0.i[1] < (int)auVar81._4_4_) * auVar81._4_4_ |
                               (uint)(tray.tnear.field_0.i[1] >= (int)auVar81._4_4_) *
                               tray.tnear.field_0.i[1]) <=
                        (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar84) *
                                tray.tfar.field_0.i[1] |
                               (tray.tfar.field_0.i[1] >= (int)uVar84) * uVar84);
                uVar84 = -(uint)bVar4;
                bVar5 = (float)((tray.tnear.field_0.i[2] < (int)auVar81._8_4_) * auVar81._8_4_ |
                               (uint)(tray.tnear.field_0.i[2] >= (int)auVar81._8_4_) *
                               tray.tnear.field_0.i[2]) <=
                        (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar87) *
                                tray.tfar.field_0.i[2] |
                               (tray.tfar.field_0.i[2] >= (int)uVar87) * uVar87);
                uVar87 = -(uint)bVar5;
                bVar6 = (float)((tray.tnear.field_0.i[3] < (int)auVar81._12_4_) * auVar81._12_4_ |
                               (uint)(tray.tnear.field_0.i[3] >= (int)auVar81._12_4_) *
                               tray.tnear.field_0.i[3]) <=
                        (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar90) *
                                tray.tfar.field_0.i[3] |
                               (tray.tfar.field_0.i[3] >= (int)uVar90) * uVar90);
                uVar90 = -(uint)bVar6;
                if (uVar13 == 6) {
                  fVar64 = *(float *)((long)&pRVar18[10].scene + uVar17);
                  fVar68 = *(float *)((long)&pRVar18[10].args + uVar17);
                  uVar14 = -(uint)((fVar65 < fVar68 && fVar64 <= fVar65) && bVar12);
                  uVar84 = -(uint)((fVar69 < fVar68 && fVar64 <= fVar69) && bVar4);
                  uVar87 = -(uint)((fVar72 < fVar68 && fVar64 <= fVar72) && bVar5);
                  uVar90 = -(uint)((fVar75 < fVar68 && fVar64 <= fVar75) && bVar6);
                }
              }
              else {
                fVar64 = *(float *)((long)&pRVar18[2].scene + uVar17);
                fVar68 = *(float *)((long)&pRVar18[2].args + uVar17);
                fVar71 = *(float *)((long)&pRVar18[3].user + uVar17);
                fVar74 = *(float *)((long)&pRVar18[4].scene + uVar17);
                fVar77 = *(float *)((long)&pRVar18[4].args + uVar17);
                fVar83 = *(float *)((long)&pRVar18[5].user + uVar17);
                fVar86 = *(float *)((long)&pRVar18[6].scene + uVar17);
                fVar89 = *(float *)((long)&pRVar18[6].args + uVar17);
                fVar94 = *(float *)((long)&pRVar18[7].user + uVar17);
                fVar26 = *(float *)((long)&pRVar18[10].scene + uVar17);
                fVar27 = *(float *)((long)&pRVar18[10].args + uVar17);
                auVar82._0_4_ =
                     fVar64 * (float)tray.dir.field_0._0_4_ +
                     fVar74 * (float)tray.dir.field_0._16_4_ +
                     fVar86 * (float)tray.dir.field_0._32_4_;
                auVar82._4_4_ =
                     fVar64 * (float)tray.dir.field_0._4_4_ +
                     fVar74 * (float)tray.dir.field_0._20_4_ +
                     fVar86 * (float)tray.dir.field_0._36_4_;
                auVar82._8_4_ =
                     fVar64 * (float)tray.dir.field_0._8_4_ +
                     fVar74 * (float)tray.dir.field_0._24_4_ +
                     fVar86 * (float)tray.dir.field_0._40_4_;
                auVar82._12_4_ =
                     fVar64 * (float)tray.dir.field_0._12_4_ +
                     fVar74 * (float)tray.dir.field_0._28_4_ +
                     fVar86 * (float)tray.dir.field_0._44_4_;
                auVar67._0_4_ =
                     fVar68 * (float)tray.dir.field_0._0_4_ +
                     fVar77 * (float)tray.dir.field_0._16_4_ +
                     fVar89 * (float)tray.dir.field_0._32_4_;
                auVar67._4_4_ =
                     fVar68 * (float)tray.dir.field_0._4_4_ +
                     fVar77 * (float)tray.dir.field_0._20_4_ +
                     fVar89 * (float)tray.dir.field_0._36_4_;
                auVar67._8_4_ =
                     fVar68 * (float)tray.dir.field_0._8_4_ +
                     fVar77 * (float)tray.dir.field_0._24_4_ +
                     fVar89 * (float)tray.dir.field_0._40_4_;
                auVar67._12_4_ =
                     fVar68 * (float)tray.dir.field_0._12_4_ +
                     fVar77 * (float)tray.dir.field_0._28_4_ +
                     fVar89 * (float)tray.dir.field_0._44_4_;
                fVar44 = *(float *)((long)&pRVar18[0xb].user + uVar17);
                auVar61._0_4_ =
                     (float)tray.dir.field_0._0_4_ * fVar71 +
                     (float)tray.dir.field_0._16_4_ * fVar83 +
                     (float)tray.dir.field_0._32_4_ * fVar94;
                auVar61._4_4_ =
                     (float)tray.dir.field_0._4_4_ * fVar71 +
                     (float)tray.dir.field_0._20_4_ * fVar83 +
                     (float)tray.dir.field_0._36_4_ * fVar94;
                auVar61._8_4_ =
                     (float)tray.dir.field_0._8_4_ * fVar71 +
                     (float)tray.dir.field_0._24_4_ * fVar83 +
                     (float)tray.dir.field_0._40_4_ * fVar94;
                auVar61._12_4_ =
                     (float)tray.dir.field_0._12_4_ * fVar71 +
                     (float)tray.dir.field_0._28_4_ * fVar83 +
                     (float)tray.dir.field_0._44_4_ * fVar94;
                fVar45 = (float)DAT_01f80d30;
                fVar113 = DAT_01f80d30._4_4_;
                fVar116 = DAT_01f80d30._8_4_;
                fVar117 = DAT_01f80d30._12_4_;
                auVar37._4_4_ = -(uint)(ABS(auVar82._4_4_) < fVar113);
                auVar37._0_4_ = -(uint)(ABS(auVar82._0_4_) < fVar45);
                auVar37._8_4_ = -(uint)(ABS(auVar82._8_4_) < fVar116);
                auVar37._12_4_ = -(uint)(ABS(auVar82._12_4_) < fVar117);
                auVar96 = blendvps(auVar82,_DAT_01f80d30,auVar37);
                auVar38._4_4_ = -(uint)(ABS(auVar67._4_4_) < fVar113);
                auVar38._0_4_ = -(uint)(ABS(auVar67._0_4_) < fVar45);
                auVar38._8_4_ = -(uint)(ABS(auVar67._8_4_) < fVar116);
                auVar38._12_4_ = -(uint)(ABS(auVar67._12_4_) < fVar117);
                auVar111 = blendvps(auVar67,_DAT_01f80d30,auVar38);
                auVar39._4_4_ = -(uint)(ABS(auVar61._4_4_) < fVar113);
                auVar39._0_4_ = -(uint)(ABS(auVar61._0_4_) < fVar45);
                auVar39._8_4_ = -(uint)(ABS(auVar61._8_4_) < fVar116);
                auVar39._12_4_ = -(uint)(ABS(auVar61._12_4_) < fVar117);
                auVar60 = blendvps(auVar61,_DAT_01f80d30,auVar39);
                fVar45 = *(float *)((long)&pRVar18[0xc].scene + uVar17);
                fVar113 = *(float *)((long)&pRVar18[0xc].args + uVar17);
                fVar116 = *(float *)((long)&pRVar18[0xd].user + uVar17);
                fVar62 = *(float *)(ray + 0x70);
                fVar63 = *(float *)(ray + 0x74);
                fVar65 = *(float *)(ray + 0x78);
                fVar69 = *(float *)(ray + 0x7c);
                fVar72 = 1.0 - fVar62;
                fVar92 = 1.0 - fVar63;
                fVar101 = 1.0 - fVar65;
                fVar103 = 1.0 - fVar69;
                auVar97._0_4_ = fVar44 * fVar62;
                auVar97._4_4_ = fVar44 * fVar63;
                auVar97._8_4_ = fVar44 * fVar65;
                auVar97._12_4_ = fVar44 * fVar69;
                fVar47 = fVar72 * 0.0;
                fVar51 = fVar92 * 0.0;
                fVar55 = fVar101 * 0.0;
                fVar58 = fVar103 * 0.0;
                auVar120 = rcpps(auVar97,auVar96);
                fVar75 = auVar120._0_4_;
                fVar93 = auVar120._4_4_;
                fVar102 = auVar120._8_4_;
                fVar104 = auVar120._12_4_;
                fVar75 = (1.0 - auVar96._0_4_ * fVar75) * fVar75 + fVar75;
                fVar93 = (1.0 - auVar96._4_4_ * fVar93) * fVar93 + fVar93;
                fVar102 = (1.0 - auVar96._8_4_ * fVar102) * fVar102 + fVar102;
                fVar104 = (1.0 - auVar96._12_4_ * fVar104) * fVar104 + fVar104;
                auVar96 = rcpps(auVar120,auVar111);
                fVar78 = auVar96._0_4_;
                fVar85 = auVar96._4_4_;
                fVar88 = auVar96._8_4_;
                fVar91 = auVar96._12_4_;
                fVar78 = (1.0 - auVar111._0_4_ * fVar78) * fVar78 + fVar78;
                fVar85 = (1.0 - auVar111._4_4_ * fVar85) * fVar85 + fVar85;
                fVar88 = (1.0 - auVar111._8_4_ * fVar88) * fVar88 + fVar88;
                fVar91 = (1.0 - auVar111._12_4_ * fVar91) * fVar91 + fVar91;
                auVar111 = rcpps(auVar96,auVar60);
                fVar66 = auVar111._0_4_;
                fVar70 = auVar111._4_4_;
                fVar73 = auVar111._8_4_;
                fVar76 = auVar111._12_4_;
                fVar66 = (1.0 - auVar60._0_4_ * fVar66) * fVar66 + fVar66;
                fVar70 = (1.0 - auVar60._4_4_ * fVar70) * fVar70 + fVar70;
                fVar73 = (1.0 - auVar60._8_4_ * fVar73) * fVar73 + fVar73;
                fVar76 = (1.0 - auVar60._12_4_ * fVar76) * fVar76 + fVar76;
                fVar44 = *(float *)((long)&pRVar18[8].scene + uVar17);
                fVar117 = *(float *)((long)&pRVar18[8].args + uVar17);
                fVar54 = *(float *)((long)&pRVar18[9].user + uVar17);
                fVar95 = fVar64 * (float)tray.org.field_0._0_4_ +
                         fVar74 * (float)tray.org.field_0._16_4_ +
                         fVar86 * (float)tray.org.field_0._32_4_ + fVar44;
                fVar98 = fVar64 * (float)tray.org.field_0._4_4_ +
                         fVar74 * (float)tray.org.field_0._20_4_ +
                         fVar86 * (float)tray.org.field_0._36_4_ + fVar44;
                fVar99 = fVar64 * (float)tray.org.field_0._8_4_ +
                         fVar74 * (float)tray.org.field_0._24_4_ +
                         fVar86 * (float)tray.org.field_0._40_4_ + fVar44;
                fVar100 = fVar64 * (float)tray.org.field_0._12_4_ +
                          fVar74 * (float)tray.org.field_0._28_4_ +
                          fVar86 * (float)tray.org.field_0._44_4_ + fVar44;
                fVar64 = fVar68 * (float)tray.org.field_0._0_4_ +
                         fVar77 * (float)tray.org.field_0._16_4_ +
                         fVar89 * (float)tray.org.field_0._32_4_ + fVar117;
                fVar74 = fVar68 * (float)tray.org.field_0._4_4_ +
                         fVar77 * (float)tray.org.field_0._20_4_ +
                         fVar89 * (float)tray.org.field_0._36_4_ + fVar117;
                fVar44 = fVar68 * (float)tray.org.field_0._8_4_ +
                         fVar77 * (float)tray.org.field_0._24_4_ +
                         fVar89 * (float)tray.org.field_0._40_4_ + fVar117;
                fVar68 = fVar68 * (float)tray.org.field_0._12_4_ +
                         fVar77 * (float)tray.org.field_0._28_4_ +
                         fVar89 * (float)tray.org.field_0._44_4_ + fVar117;
                fVar77 = fVar71 * (float)tray.org.field_0._0_4_ +
                         fVar83 * (float)tray.org.field_0._16_4_ +
                         fVar94 * (float)tray.org.field_0._32_4_ + fVar54;
                fVar86 = fVar71 * (float)tray.org.field_0._4_4_ +
                         fVar83 * (float)tray.org.field_0._20_4_ +
                         fVar94 * (float)tray.org.field_0._36_4_ + fVar54;
                fVar89 = fVar71 * (float)tray.org.field_0._8_4_ +
                         fVar83 * (float)tray.org.field_0._24_4_ +
                         fVar94 * (float)tray.org.field_0._40_4_ + fVar54;
                fVar83 = fVar71 * (float)tray.org.field_0._12_4_ +
                         fVar83 * (float)tray.org.field_0._28_4_ +
                         fVar94 * (float)tray.org.field_0._44_4_ + fVar54;
                fVar117 = ((fVar26 * fVar62 + fVar47) - fVar95) * fVar75;
                fVar54 = ((fVar26 * fVar63 + fVar51) - fVar98) * fVar93;
                fVar108 = ((fVar26 * fVar65 + fVar55) - fVar99) * fVar102;
                fVar110 = ((fVar26 * fVar69 + fVar58) - fVar100) * fVar104;
                fVar75 = ((fVar45 * fVar62 + fVar72) - fVar95) * fVar75;
                fVar93 = ((fVar45 * fVar63 + fVar92) - fVar98) * fVar93;
                fVar102 = ((fVar45 * fVar65 + fVar101) - fVar99) * fVar102;
                fVar104 = ((fVar45 * fVar69 + fVar103) - fVar100) * fVar104;
                fVar94 = ((fVar27 * fVar62 + fVar47) - fVar64) * fVar78;
                fVar26 = ((fVar27 * fVar63 + fVar51) - fVar74) * fVar85;
                fVar45 = ((fVar27 * fVar65 + fVar55) - fVar44) * fVar88;
                fVar27 = ((fVar27 * fVar69 + fVar58) - fVar68) * fVar91;
                fVar78 = ((fVar113 * fVar62 + fVar72) - fVar64) * fVar78;
                fVar85 = ((fVar113 * fVar63 + fVar92) - fVar74) * fVar85;
                fVar88 = ((fVar113 * fVar65 + fVar101) - fVar44) * fVar88;
                fVar91 = ((fVar113 * fVar69 + fVar103) - fVar68) * fVar91;
                fVar64 = ((fVar47 + auVar97._0_4_) - fVar77) * fVar66;
                fVar68 = ((fVar51 + auVar97._4_4_) - fVar86) * fVar70;
                fVar71 = ((fVar55 + auVar97._8_4_) - fVar89) * fVar73;
                fVar74 = ((fVar58 + auVar97._12_4_) - fVar83) * fVar76;
                fVar66 = ((fVar116 * fVar62 + fVar72) - fVar77) * fVar66;
                fVar70 = ((fVar116 * fVar63 + fVar92) - fVar86) * fVar70;
                fVar73 = ((fVar116 * fVar65 + fVar101) - fVar89) * fVar73;
                fVar76 = ((fVar116 * fVar69 + fVar103) - fVar83) * fVar76;
                uVar14 = (uint)((int)fVar75 < (int)fVar117) * (int)fVar75 |
                         (uint)((int)fVar75 >= (int)fVar117) * (int)fVar117;
                uVar84 = (uint)((int)fVar93 < (int)fVar54) * (int)fVar93 |
                         (uint)((int)fVar93 >= (int)fVar54) * (int)fVar54;
                uVar87 = (uint)((int)fVar102 < (int)fVar108) * (int)fVar102 |
                         (uint)((int)fVar102 >= (int)fVar108) * (int)fVar108;
                uVar90 = (uint)((int)fVar104 < (int)fVar110) * (int)fVar104 |
                         (uint)((int)fVar104 >= (int)fVar110) * (int)fVar110;
                uVar105 = (uint)((int)fVar78 < (int)fVar94) * (int)fVar78 |
                          (uint)((int)fVar78 >= (int)fVar94) * (int)fVar94;
                uVar106 = (uint)((int)fVar85 < (int)fVar26) * (int)fVar85 |
                          (uint)((int)fVar85 >= (int)fVar26) * (int)fVar26;
                uVar107 = (uint)((int)fVar88 < (int)fVar45) * (int)fVar88 |
                          (uint)((int)fVar88 >= (int)fVar45) * (int)fVar45;
                uVar109 = (uint)((int)fVar91 < (int)fVar27) * (int)fVar91 |
                          (uint)((int)fVar91 >= (int)fVar27) * (int)fVar27;
                uVar14 = ((int)uVar105 < (int)uVar14) * uVar14 |
                         ((int)uVar105 >= (int)uVar14) * uVar105;
                uVar84 = ((int)uVar106 < (int)uVar84) * uVar84 |
                         ((int)uVar106 >= (int)uVar84) * uVar106;
                uVar87 = ((int)uVar107 < (int)uVar87) * uVar87 |
                         ((int)uVar107 >= (int)uVar87) * uVar107;
                uVar90 = ((int)uVar109 < (int)uVar90) * uVar90 |
                         ((int)uVar109 >= (int)uVar90) * uVar109;
                uVar105 = (uint)((int)fVar66 < (int)fVar64) * (int)fVar66 |
                          (uint)((int)fVar66 >= (int)fVar64) * (int)fVar64;
                uVar106 = (uint)((int)fVar70 < (int)fVar68) * (int)fVar70 |
                          (uint)((int)fVar70 >= (int)fVar68) * (int)fVar68;
                uVar107 = (uint)((int)fVar73 < (int)fVar71) * (int)fVar73 |
                          (uint)((int)fVar73 >= (int)fVar71) * (int)fVar71;
                uVar109 = (uint)((int)fVar76 < (int)fVar74) * (int)fVar76 |
                          (uint)((int)fVar76 >= (int)fVar74) * (int)fVar74;
                auVar81._0_4_ =
                     ((int)uVar105 < (int)uVar14) * uVar14 | ((int)uVar105 >= (int)uVar14) * uVar105
                ;
                auVar81._4_4_ =
                     ((int)uVar106 < (int)uVar84) * uVar84 | ((int)uVar106 >= (int)uVar84) * uVar106
                ;
                auVar81._8_4_ =
                     ((int)uVar107 < (int)uVar87) * uVar87 | ((int)uVar107 >= (int)uVar87) * uVar107
                ;
                auVar81._12_4_ =
                     ((int)uVar109 < (int)uVar90) * uVar90 | ((int)uVar109 >= (int)uVar90) * uVar109
                ;
                uVar105 = (uint)((int)fVar75 < (int)fVar117) * (int)fVar117 |
                          (uint)((int)fVar75 >= (int)fVar117) * (int)fVar75;
                uVar106 = (uint)((int)fVar93 < (int)fVar54) * (int)fVar54 |
                          (uint)((int)fVar93 >= (int)fVar54) * (int)fVar93;
                uVar107 = (uint)((int)fVar102 < (int)fVar108) * (int)fVar108 |
                          (uint)((int)fVar102 >= (int)fVar108) * (int)fVar102;
                uVar109 = (uint)((int)fVar104 < (int)fVar110) * (int)fVar110 |
                          (uint)((int)fVar104 >= (int)fVar110) * (int)fVar104;
                uVar14 = (uint)((int)fVar78 < (int)fVar94) * (int)fVar94 |
                         (uint)((int)fVar78 >= (int)fVar94) * (int)fVar78;
                uVar84 = (uint)((int)fVar85 < (int)fVar26) * (int)fVar26 |
                         (uint)((int)fVar85 >= (int)fVar26) * (int)fVar85;
                uVar87 = (uint)((int)fVar88 < (int)fVar45) * (int)fVar45 |
                         (uint)((int)fVar88 >= (int)fVar45) * (int)fVar88;
                uVar90 = (uint)((int)fVar91 < (int)fVar27) * (int)fVar27 |
                         (uint)((int)fVar91 >= (int)fVar27) * (int)fVar91;
                uVar14 = ((int)uVar105 < (int)uVar14) * uVar105 |
                         ((int)uVar105 >= (int)uVar14) * uVar14;
                uVar84 = ((int)uVar106 < (int)uVar84) * uVar106 |
                         ((int)uVar106 >= (int)uVar84) * uVar84;
                uVar87 = ((int)uVar107 < (int)uVar87) * uVar107 |
                         ((int)uVar107 >= (int)uVar87) * uVar87;
                uVar90 = ((int)uVar109 < (int)uVar90) * uVar109 |
                         ((int)uVar109 >= (int)uVar90) * uVar90;
                uVar105 = (uint)((int)fVar66 < (int)fVar64) * (int)fVar64 |
                          (uint)((int)fVar66 >= (int)fVar64) * (int)fVar66;
                uVar106 = (uint)((int)fVar70 < (int)fVar68) * (int)fVar68 |
                          (uint)((int)fVar70 >= (int)fVar68) * (int)fVar70;
                uVar107 = (uint)((int)fVar73 < (int)fVar71) * (int)fVar71 |
                          (uint)((int)fVar73 >= (int)fVar71) * (int)fVar73;
                uVar109 = (uint)((int)fVar76 < (int)fVar74) * (int)fVar74 |
                          (uint)((int)fVar76 >= (int)fVar74) * (int)fVar76;
                uVar14 = ((int)uVar14 < (int)uVar105) * uVar14 |
                         ((int)uVar14 >= (int)uVar105) * uVar105;
                uVar84 = ((int)uVar84 < (int)uVar106) * uVar84 |
                         ((int)uVar84 >= (int)uVar106) * uVar106;
                uVar87 = ((int)uVar87 < (int)uVar107) * uVar87 |
                         ((int)uVar87 >= (int)uVar107) * uVar107;
                uVar90 = ((int)uVar90 < (int)uVar109) * uVar90 |
                         ((int)uVar90 >= (int)uVar109) * uVar109;
                uVar14 = -(uint)((float)((tray.tnear.field_0.i[0] < (int)auVar81._0_4_) *
                                         auVar81._0_4_ |
                                        (uint)(tray.tnear.field_0.i[0] >= (int)auVar81._0_4_) *
                                        tray.tnear.field_0.i[0]) <=
                                (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar14) *
                                        tray.tfar.field_0.i[0] |
                                       (tray.tfar.field_0.i[0] >= (int)uVar14) * uVar14));
                uVar84 = -(uint)((float)((tray.tnear.field_0.i[1] < (int)auVar81._4_4_) *
                                         auVar81._4_4_ |
                                        (uint)(tray.tnear.field_0.i[1] >= (int)auVar81._4_4_) *
                                        tray.tnear.field_0.i[1]) <=
                                (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar84) *
                                        tray.tfar.field_0.i[1] |
                                       (tray.tfar.field_0.i[1] >= (int)uVar84) * uVar84));
                uVar87 = -(uint)((float)((tray.tnear.field_0.i[2] < (int)auVar81._8_4_) *
                                         auVar81._8_4_ |
                                        (uint)(tray.tnear.field_0.i[2] >= (int)auVar81._8_4_) *
                                        tray.tnear.field_0.i[2]) <=
                                (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar87) *
                                        tray.tfar.field_0.i[2] |
                                       (tray.tfar.field_0.i[2] >= (int)uVar87) * uVar87));
                uVar90 = -(uint)((float)((tray.tnear.field_0.i[3] < (int)auVar81._12_4_) *
                                         auVar81._12_4_ |
                                        (uint)(tray.tnear.field_0.i[3] >= (int)auVar81._12_4_) *
                                        tray.tnear.field_0.i[3]) <=
                                (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar90) *
                                        tray.tfar.field_0.i[3] |
                                       (tray.tfar.field_0.i[3] >= (int)uVar90) * uVar90));
                aVar121 = _DAT_01f7a9f0;
              }
              auVar40._0_4_ = (uVar14 & -(uint)(fVar46 < tray.tfar.field_0.v[0])) << 0x1f;
              auVar40._4_4_ = (uVar84 & -(uint)(fVar50 < tray.tfar.field_0.v[1])) << 0x1f;
              auVar40._8_4_ = (uVar87 & -(uint)(fVar53 < tray.tfar.field_0.v[2])) << 0x1f;
              auVar40._12_4_ = (uVar90 & -(uint)(fVar57 < tray.tfar.field_0.v[3])) << 0x1f;
              uVar14 = movmskps((int)pIVar21,auVar40);
              pIVar21 = (Intersectors *)(ulong)uVar14;
              if (uVar14 == 0) {
                aVar49.i[1] = iVar52;
                aVar49.i[0] = iVar25;
                aVar49.i[2] = iVar56;
                aVar49.i[3] = iVar59;
                root.ptr = sVar20;
              }
              else {
                aVar49.v = (__m128)blendvps(aVar121.v,auVar81,auVar40);
                if (sVar20 != 8) {
                  pNVar24->ptr = sVar20;
                  pNVar24 = pNVar24 + 1;
                  paVar23->i[0] = iVar25;
                  paVar23->i[1] = iVar52;
                  paVar23->i[2] = iVar56;
                  paVar23->i[3] = iVar59;
                  paVar23 = paVar23 + 1;
                }
              }
              iVar25 = aVar49.i[0];
              iVar52 = aVar49.i[1];
              iVar56 = aVar49.i[2];
              iVar59 = aVar49.i[3];
              pRVar18 = (RayQueryContext *)((long)&pRVar18->scene + 4);
              sVar20 = root.ptr;
            } while (pRVar18 != (RayQueryContext *)0x0);
            pRVar19 = pRVar18;
            if (root.ptr == 8) goto LAB_0023e4ba;
            auVar41._4_4_ = -(uint)(aVar49.v[1] < tray.tfar.field_0.v[1]);
            auVar41._0_4_ = -(uint)(aVar49.v[0] < tray.tfar.field_0.v[0]);
            auVar41._8_4_ = -(uint)(aVar49.v[2] < tray.tfar.field_0.v[2]);
            auVar41._12_4_ = -(uint)(aVar49.v[3] < tray.tfar.field_0.v[3]);
            uVar15 = movmskps((int)uVar17,auVar41);
            uVar13 = POPCOUNT(uVar15);
          } while ((byte)uVar16 < (byte)uVar13);
          pNVar24->ptr = root.ptr;
          pNVar24 = pNVar24 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar23->v = aVar49;
          paVar23 = paVar23 + 1;
LAB_0023e4ba:
          uVar13 = 4;
        }
        else {
          do {
            sVar20 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> sVar20 & 1) == 0; sVar20 = sVar20 + 1) {
              }
            }
            tray_00 = &tray;
            pIVar21 = This;
            pRVar19 = context;
            bVar12 = occluded1(This,bvh,root,sVar20,&pre,ray,tray_00,context);
            if (bVar12) {
              terminated.field_0.i[sVar20] = -1;
            }
            uVar17 = uVar17 & uVar17 - 1;
          } while (uVar17 != 0);
          iVar25 = movmskps((int)tray_00,(undefined1  [16])terminated.field_0);
          uVar13 = 3;
          if (iVar25 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                          (undefined1  [16])terminated.field_0);
            uVar13 = 2;
          }
          aVar121 = _DAT_01f7a9f0;
          if (uVar16 < uVar14) goto LAB_0023dee4;
        }
      } while (uVar13 != 3);
LAB_0023e66a:
      auVar43._0_4_ = auVar48._0_4_ & terminated.field_0.i[0];
      auVar43._4_4_ = auVar48._4_4_ & terminated.field_0.i[1];
      auVar43._8_4_ = auVar48._8_4_ & terminated.field_0.i[2];
      auVar43._12_4_ = auVar48._12_4_ & terminated.field_0.i[3];
      auVar60 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f7aa00,auVar43);
      *(undefined1 (*) [16])(ray + 0x80) = auVar60;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }